

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

void addrinfo_sort_list(addrinfo **ailist,_func_int_addrinfo_ptr_addrinfo_ptr *compare)

{
  addrinfo *paVar1;
  int iVar2;
  bool bVar3;
  addrinfo *local_40;
  addrinfo *last;
  addrinfo *ai2;
  addrinfo *temp;
  addrinfo *ai;
  addrinfo *result;
  _func_int_addrinfo_ptr_addrinfo_ptr *compare_local;
  addrinfo **ailist_local;
  
  ai = (addrinfo *)0x0;
  temp = *ailist;
  while (temp != (addrinfo *)0x0) {
    paVar1 = temp->ai_next;
    if (ai == (addrinfo *)0x0) {
      ai = temp;
      temp->ai_next = (addrinfo *)0x0;
      temp = paVar1;
    }
    else {
      last = ai;
      local_40 = (addrinfo *)0x0;
      while( true ) {
        bVar3 = false;
        if (last != (addrinfo *)0x0) {
          iVar2 = (*compare)(temp,last);
          bVar3 = -1 < iVar2;
        }
        if (!bVar3) break;
        local_40 = last;
        last = last->ai_next;
      }
      if (local_40 == (addrinfo *)0x0) {
        ai = temp;
        temp->ai_next = last;
        temp = paVar1;
      }
      else {
        local_40->ai_next = temp;
        temp->ai_next = last;
        temp = paVar1;
      }
    }
  }
  *ailist = ai;
  return;
}

Assistant:

void addrinfo_sort_list(struct addrinfo **ailist,
    int (*compare)(const struct addrinfo*, const struct addrinfo*))
{
    struct addrinfo *result = NULL, *ai = (*ailist);
    while (ai)
    {
        struct addrinfo *temp = ai;
        ai = ai->ai_next;
        if (result)
        {
            struct addrinfo *ai2 = result, *last = NULL;
            while (ai2 && (compare(temp, ai2) >= 0))
            {
                last = ai2;
                ai2 = ai2->ai_next;
            }
            if (last)
            {
                last->ai_next = temp;
                temp->ai_next = ai2;
            }
            else
            {
                result = temp;
                temp->ai_next = ai2;
            }
        }
        else
        {
            result = temp;
            temp->ai_next = NULL;
        }
    }
    *ailist = result;
}